

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

int Nwk_ManGetTotalFanins(Nwk_Man_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)pNtk->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) {
        iVar2 = iVar2 + *(int *)((long)pvVar1 + 0x3c);
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Nwk_ManGetTotalFanins( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, nFanins = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
        nFanins += Nwk_ObjFaninNum(pNode);
    return nFanins;
}